

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O3

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcStructuralItem,_0UL>::Construct
                   (DB *db,LIST *params)

{
  IfcProduct *this;
  
  this = (IfcProduct *)operator_new(0x128);
  *(undefined ***)&this->field_0x110 = &PTR__Object_00816a50;
  *(undefined8 *)&this[1].super_IfcObject = 0;
  *(char **)&this[1].super_IfcObject.field_0x8 = "IfcStructuralItem";
  Assimp::IFC::Schema_2x3::IfcProduct::IfcProduct(this,&PTR_construction_vtable_24__00826ef0);
  *(undefined ***)&this->super_IfcObject = &PTR__IfcStructuralItem_00826e10;
  *(undefined ***)&this->field_0x110 = &PTR__IfcStructuralItem_00826ed8;
  *(undefined ***)&(this->super_IfcObject).field_0x88 = &PTR__IfcStructuralItem_00826e38;
  (this->super_IfcObject).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.
  _vptr_ObjectHelper = (_func_int **)&PTR__IfcStructuralItem_00826e60;
  *(undefined ***)&(this->super_IfcObject).field_0xd0 = &PTR__IfcStructuralItem_00826e88;
  *(undefined ***)&this->field_0x100 = &PTR__IfcStructuralItem_00826eb0;
  GenericFill<Assimp::IFC::Schema_2x3::IfcProduct>(db,params,this);
  return (Object *)
         (&(this->super_IfcObject).field_0x0 + *(long *)(*(long *)&this->super_IfcObject + -0x18));
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }